

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O3

void __thiscall FailableMemoryAllocator::checkAllFailedAllocsWereDone(FailableMemoryAllocator *this)

{
  LocationToFailAllocNode *pLVar1;
  int lineNumber;
  UtestShell *this_00;
  char *fileName;
  SimpleString failText;
  SimpleString SStack_68;
  undefined1 local_60 [80];
  
  if (this->head_ != (LocationToFailAllocNode *)0x0) {
    this_00 = UtestShell::getCurrent();
    SimpleString::SimpleString(&SStack_68,"");
    pLVar1 = this->head_;
    if (pLVar1->file_ == (char *)0x0) {
      StringFromFormat(local_60 + 0x10,"Expected allocation number %d was never done",
                       (ulong)(uint)pLVar1->allocNumberToFail_);
      SimpleString::operator=(&SStack_68,(SimpleString *)(local_60 + 0x10));
    }
    else {
      StringFromFormat(local_60 + 0x10,"Expected failing alloc at %s:%d was never done",
                       pLVar1->file_,(ulong)(uint)pLVar1->line_);
      SimpleString::operator=(&SStack_68,(SimpleString *)(local_60 + 0x10));
    }
    SimpleString::~SimpleString((SimpleString *)(local_60 + 0x10));
    UtestShell::getName((UtestShell *)local_60);
    fileName = SimpleString::asCharString((SimpleString *)local_60);
    lineNumber = UtestShell::getLineNumber(this_00);
    FailFailure::FailFailure
              ((FailFailure *)(local_60 + 0x10),this_00,fileName,lineNumber,&SStack_68);
    local_60._8_8_ = &PTR_exitCurrentTest_001e1ab0;
    (*this_00->_vptr_UtestShell[0x25])(this_00,local_60 + 0x10);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)(local_60 + 8));
    TestFailure::~TestFailure((TestFailure *)(local_60 + 0x10));
    SimpleString::~SimpleString((SimpleString *)local_60);
    SimpleString::~SimpleString(&SStack_68);
  }
  return;
}

Assistant:

void FailableMemoryAllocator::checkAllFailedAllocsWereDone()
{
  if (head_) {
    UtestShell* currentTest = UtestShell::getCurrent();
    SimpleString failText;
    if (head_->file_)
      failText = StringFromFormat("Expected failing alloc at %s:%d was never done", head_->file_, head_->line_);
    else
      failText = StringFromFormat("Expected allocation number %d was never done", head_->allocNumberToFail_);

    currentTest->failWith(FailFailure(currentTest, currentTest->getName().asCharString(),
    currentTest->getLineNumber(), failText), TestTerminatorWithoutExceptions());
  }
}